

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

void __thiscall
ON_SimpleArray<ON_2dPoint>::Insert(ON_SimpleArray<ON_2dPoint> *this,int i,ON_2dPoint *x)

{
  ON_2dPoint *pOVar1;
  double dVar2;
  uint uVar3;
  ON_2dPoint *memblock;
  uint uVar4;
  
  if (-1 < i) {
    uVar4 = this->m_count;
    if (i <= (int)uVar4) {
      memblock = x;
      if (uVar4 == this->m_capacity) {
        if (x < this->m_a + uVar4 && this->m_a <= x) {
          memblock = (ON_2dPoint *)onmalloc(0x10);
          dVar2 = x->y;
          memblock->x = x->x;
          memblock->y = dVar2;
          uVar4 = this->m_count;
        }
        if (((int)uVar4 < 8) || ((ulong)((long)(int)uVar4 * 0x10) < 0x10000001)) {
          uVar3 = 4;
          if (2 < (int)uVar4) {
            uVar3 = uVar4 * 2;
          }
        }
        else {
          uVar3 = 0x1000008;
          if (uVar4 < 0x1000008) {
            uVar3 = uVar4;
          }
          uVar3 = uVar3 + uVar4;
        }
        if ((uint)this->m_capacity < uVar3) {
          SetCapacity(this,(long)(int)uVar3);
          uVar4 = this->m_count;
        }
      }
      this->m_count = uVar4 + 1;
      Move(this,i + 1,i,uVar4 - i);
      pOVar1 = this->m_a;
      dVar2 = memblock->y;
      pOVar1[(uint)i].x = memblock->x;
      pOVar1[(uint)i].y = dVar2;
      if (memblock != x) {
        onfree(memblock);
        return;
      }
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}